

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::releaseFboAttachmentReference(ReferenceContext *this,Attachment *attachment)

{
  Texture *object;
  Renderbuffer *object_00;
  TestError *this_00;
  
  if (attachment->type == ATTACHMENTTYPE_RENDERBUFFER) {
    if (attachment->name == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x7a5);
    }
    else {
      object_00 = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                            (&this->m_renderbuffers,attachment->name);
      if (object_00 != (Renderbuffer *)0x0) {
        rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference
                  (&this->m_renderbuffers,object_00);
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"rbo",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x7a7);
    }
  }
  else {
    if (attachment->type != ATTACHMENTTYPE_TEXTURE) {
      return;
    }
    if (attachment->name == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x79c);
    }
    else {
      object = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,attachment->name);
      if (object != (Texture *)0x0) {
        rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,object);
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"texture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x79e);
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ReferenceContext::releaseFboAttachmentReference (const Framebuffer::Attachment& attachment)
{
	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			TCU_CHECK(attachment.name != 0);
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);
			m_textures.releaseReference(texture);
			break;
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			TCU_CHECK(attachment.name != 0);
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);
			m_renderbuffers.releaseReference(rbo);
			break;
		}

		default:
			break; // Silently ignore
	}
}